

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O1

sunindextype
SUNDlsMat_bandGBTRF(sunrealtype **a,sunindextype n,sunindextype mu,sunindextype ml,sunindextype smu,
                   sunindextype *p)

{
  long lVar1;
  sunrealtype sVar2;
  sunrealtype *psVar3;
  long lVar4;
  double dVar5;
  long lVar6;
  sunindextype sVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  
  if (0 < n && (smu - mu != 0 && mu <= smu)) {
    lVar15 = 0;
    do {
      memset(a[lVar15],0,(smu - mu) * 8);
      lVar15 = lVar15 + 1;
    } while (n != lVar15);
  }
  lVar15 = n + -1;
  if (1 < n) {
    lVar13 = 0;
    do {
      psVar3 = a[lVar13];
      lVar11 = lVar13 + ml;
      if (n <= lVar13 + ml) {
        lVar11 = lVar15;
      }
      pdVar12 = psVar3 + smu + 1;
      sVar2 = psVar3[smu];
      lVar10 = lVar13;
      if (lVar13 < lVar11) {
        dVar17 = ABS(sVar2);
        lVar6 = lVar13;
        pdVar8 = pdVar12;
        do {
          lVar6 = lVar6 + 1;
          dVar5 = ABS(*pdVar8);
          lVar9 = lVar6;
          if (ABS(*pdVar8) <= dVar17) {
            dVar5 = dVar17;
            lVar9 = lVar10;
          }
          lVar10 = lVar9;
          dVar17 = dVar5;
          pdVar8 = pdVar8 + 1;
        } while (lVar6 < lVar11);
      }
      lVar6 = lVar13 + 1;
      *p = lVar10;
      dVar17 = psVar3[(lVar10 - lVar13) + smu];
      if ((dVar17 == 0.0) && (!NAN(dVar17))) {
        return lVar6;
      }
      if (lVar10 != lVar13) {
        psVar3[(lVar10 - lVar13) + smu] = sVar2;
        psVar3[smu] = dVar17;
      }
      if (lVar13 < lVar11) {
        dVar17 = psVar3[smu];
        lVar9 = 0;
        do {
          pdVar12[lVar9] = pdVar12[lVar9] * (-1.0 / dVar17);
          lVar16 = lVar13 + lVar9;
          lVar9 = lVar9 + 1;
        } while (lVar16 + 1 < lVar11);
      }
      lVar9 = smu * 8;
      lVar1 = lVar6;
      lVar16 = lVar13;
      lVar14 = lVar13 + smu;
      if (lVar15 <= lVar13 + smu) {
        lVar14 = lVar15;
      }
      while (lVar4 = lVar1, lVar16 < lVar14) {
        psVar3 = a[lVar4];
        dVar17 = psVar3[(lVar10 - lVar4) + smu];
        if (lVar10 != lVar13) {
          psVar3[(lVar10 - lVar4) + smu] = psVar3[(lVar13 - lVar4) + smu];
          psVar3[(lVar13 - lVar4) + smu] = dVar17;
        }
        if (dVar17 != 0.0 && lVar13 < lVar11) {
          lVar16 = 0;
          do {
            *(double *)((long)psVar3 + lVar16 * 8 + lVar9) =
                 pdVar12[lVar16] * dVar17 + *(double *)((long)psVar3 + lVar16 * 8 + lVar9);
            lVar1 = lVar13 + lVar16;
            lVar16 = lVar16 + 1;
          } while (lVar1 + 1 < lVar11);
        }
        lVar9 = lVar9 + -8;
        lVar1 = lVar4 + 1;
        lVar16 = lVar4;
      }
      p = p + 1;
      lVar13 = lVar6;
    } while (lVar6 != lVar15);
  }
  *p = lVar15;
  sVar7 = n;
  if (a[n + -1][smu] != 0.0) {
    sVar7 = 0;
  }
  if (NAN(a[n + -1][smu])) {
    sVar7 = 0;
  }
  return sVar7;
}

Assistant:

sunindextype SUNDlsMat_bandGBTRF(sunrealtype** a, sunindextype n,
                                 sunindextype mu, sunindextype ml,
                                 sunindextype smu, sunindextype* p)
{
  sunindextype c, r, num_rows;
  sunindextype i, j, k, l, storage_l, storage_k, last_col_k, last_row_k;
  sunrealtype *a_c, *col_k, *diag_k, *sub_diag_k, *col_j, *kptr, *jptr;
  sunrealtype max, temp, mult, a_kj;
  sunbooleantype swap;

  /* zero out the first smu - mu rows of the rectangular array a */

  num_rows = smu - mu;
  if (num_rows > 0)
  {
    for (c = 0; c < n; c++)
    {
      a_c = a[c];
      for (r = 0; r < num_rows; r++) { a_c[r] = ZERO; }
    }
  }

  /* k = elimination step number */

  for (k = 0; k < n - 1; k++, p++)
  {
    col_k      = a[k];
    diag_k     = col_k + smu;
    sub_diag_k = diag_k + 1;
    last_row_k = SUNMIN(n - 1, k + ml);

    /* find l = pivot row number */

    l   = k;
    max = SUNRabs(*diag_k);
    for (i = k + 1, kptr = sub_diag_k; i <= last_row_k; i++, kptr++)
    {
      if (SUNRabs(*kptr) > max)
      {
        l   = i;
        max = SUNRabs(*kptr);
      }
    }
    storage_l = ROW(l, k, smu);
    *p        = l;

    /* check for zero pivot element */

    if (col_k[storage_l] == ZERO) { return (k + 1); }

    /* swap a(l,k) and a(k,k) if necessary */

    if ((swap = (l != k)))
    {
      temp             = col_k[storage_l];
      col_k[storage_l] = *diag_k;
      *diag_k          = temp;
    }

    /* Scale the elements below the diagonal in         */
    /* column k by -1.0 / a(k,k). After the above swap, */
    /* a(k,k) holds the pivot element. This scaling     */
    /* stores the pivot row multipliers -a(i,k)/a(k,k)  */
    /* in a(i,k), i=k+1, ..., SUNMIN(n-1,k+ml).            */

    mult = -ONE / (*diag_k);
    for (i = k + 1, kptr = sub_diag_k; i <= last_row_k; i++, kptr++)
    {
      (*kptr) *= mult;
    }

    /* row_i = row_i - [a(i,k)/a(k,k)] row_k, i=k+1, ..., SUNMIN(n-1,k+ml) */
    /* row k is the pivot row after swapping with row l.                */
    /* The computation is done one column at a time,                    */
    /* column j=k+1, ..., SUNMIN(k+smu,n-1).                               */

    last_col_k = SUNMIN(k + smu, n - 1);
    for (j = k + 1; j <= last_col_k; j++)
    {
      col_j     = a[j];
      storage_l = ROW(l, j, smu);
      storage_k = ROW(k, j, smu);
      a_kj      = col_j[storage_l];

      /* Swap the elements a(k,j) and a(k,l) if l!=k. */

      if (swap)
      {
        col_j[storage_l] = col_j[storage_k];
        col_j[storage_k] = a_kj;
      }

      /* a(i,j) = a(i,j) - [a(i,k)/a(k,k)]*a(k,j) */
      /* a_kj = a(k,j), *kptr = - a(i,k)/a(k,k), *jptr = a(i,j) */

      if (a_kj != ZERO)
      {
        for (i = k + 1, kptr = sub_diag_k, jptr = col_j + ROW(k + 1, j, smu);
             i <= last_row_k; i++, kptr++, jptr++)
        {
          (*jptr) += a_kj * (*kptr);
        }
      }
    }
  }

  /* set the last pivot row to be n-1 and check for a zero pivot */

  *p = n - 1;
  if (a[n - 1][smu] == ZERO) { return (n); }

  /* return 0 to indicate success */

  return (0);
}